

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArraySortMethod::ArraySortMethod
          (ArraySortMethod *this,KnownSystemName knownNameId,bool reversed)

{
  byte in_DL;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__ArraySortMethod_00df11a8;
  *(byte *)(in_RDI + 7) = in_DL & 1;
  *(undefined4 *)((long)in_RDI + 0x34) = 1;
  return;
}

Assistant:

ArraySortMethod(KnownSystemName knownNameId, bool reversed) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), reversed(reversed) {
        withClauseMode = WithClauseMode::Iterator;
    }